

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O1

void ssh1channel_initiate_close(SshChannel *sc,char *err)

{
  char *reason;
  
  if (err == (char *)0x0) {
    reason = (char *)0x0;
  }
  else {
    reason = dupprintf("due to local error: %s");
  }
  ssh1_channel_close_local((ssh1_channel *)&sc[-3].cl,reason);
  safefree(reason);
  *(undefined1 *)((long)&sc[-1].vt + 4) = 0;
  ssh1_channel_check_close((ssh1_channel *)&sc[-3].cl);
  return;
}

Assistant:

static void ssh1channel_initiate_close(SshChannel *sc, const char *err)
{
    struct ssh1_channel *c = container_of(sc, struct ssh1_channel, sc);
    char *reason;

    reason = err ? dupprintf("due to local error: %s", err) : NULL;
    ssh1_channel_close_local(c, reason);
    sfree(reason);
    c->pending_eof = false;   /* this will confuse a zombie channel */

    ssh1_channel_check_close(c);
}